

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

unsigned_long_long duckdb_zstd::ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  do {
    if (srcSize < 5) {
      uVar2 = 0xfffffffffffffffe;
      if (srcSize == 0) {
        uVar2 = uVar3;
      }
      return uVar2;
    }
    if ((*src & 0xfffffff0) == 0x184d2a50) {
      if (srcSize < 8) {
        return 0xfffffffffffffffe;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffffe;
      }
      uVar1 = (ulong)*(uint *)((long)src + 4) + 8;
      if (srcSize < uVar1) {
        return 0xfffffffffffffffe;
      }
    }
    else {
      uVar2 = ZSTD_getFrameContentSize(src,srcSize);
      if (0xfffffffffffffffd < uVar2) {
        return uVar2;
      }
      bVar4 = CARRY8(uVar3,uVar2);
      uVar3 = uVar3 + uVar2;
      if (bVar4) {
        return 0xfffffffffffffffe;
      }
      uVar1 = ZSTD_findFrameCompressedSize(src,srcSize);
      if (0xffffffffffffff88 < uVar1) {
        return 0xfffffffffffffffe;
      }
    }
    src = (void *)((long)src + uVar1);
    srcSize = srcSize - uVar1;
  } while( true );
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const fcs = ZSTD_getFrameContentSize(src, srcSize);
            if (fcs >= ZSTD_CONTENTSIZE_ERROR) return fcs;

            if (totalDstSize + fcs < totalDstSize)
                return ZSTD_CONTENTSIZE_ERROR; /* check for overflow */
            totalDstSize += fcs;
        }
        /* skip to next frame */
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(frameSrcSize <= srcSize);

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}